

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::protobuf_AddDesc_google_2fprotobuf_2fcompiler_2fplugin_2eproto
               (void)

{
  CodeGeneratorRequest *this;
  CodeGeneratorResponse *this_00;
  CodeGeneratorResponse_File *this_01;
  
  if (!protobuf_AddDesc_google_2fprotobuf_2fcompiler_2fplugin_2eproto::already_here) {
    protobuf_AddDesc_google_2fprotobuf_2fcompiler_2fplugin_2eproto::already_here = true;
    internal::VerifyVersion
              (0x1e9809,0x1e9809,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/plugin.pb.cc"
              );
    protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto();
    DescriptorPool::InternalAddGeneratedFile(anon_var_dwarf_32497,0x1bd);
    MessageFactory::InternalRegisterGeneratedFile
              ("google/protobuf/compiler/plugin.proto",anon_unknown_6::protobuf_RegisterTypes);
    this = (CodeGeneratorRequest *)operator_new(0x50);
    CodeGeneratorRequest::CodeGeneratorRequest(this);
    CodeGeneratorRequest::default_instance_ = this;
    this_00 = (CodeGeneratorResponse *)operator_new(0x38);
    CodeGeneratorResponse::CodeGeneratorResponse(this_00);
    CodeGeneratorResponse::default_instance_ = this_00;
    this_01 = (CodeGeneratorResponse_File *)operator_new(0x30);
    CodeGeneratorResponse_File::CodeGeneratorResponse_File(this_01);
    CodeGeneratorResponse_File::default_instance_ = this_01;
    CodeGeneratorRequest::InitAsDefaultInstance(CodeGeneratorRequest::default_instance_);
    CodeGeneratorResponse::InitAsDefaultInstance(CodeGeneratorResponse::default_instance_);
    CodeGeneratorResponse_File::InitAsDefaultInstance(CodeGeneratorResponse_File::default_instance_)
    ;
    internal::OnShutdown(protobuf_ShutdownFile_google_2fprotobuf_2fcompiler_2fplugin_2eproto);
  }
  return;
}

Assistant:

void protobuf_AddDesc_google_2fprotobuf_2fcompiler_2fplugin_2eproto() {
  static bool already_here = false;
  if (already_here) return;
  already_here = true;
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::protobuf_AddDesc_google_2fprotobuf_2fdescriptor_2eproto();
  ::google::protobuf::DescriptorPool::InternalAddGeneratedFile(
    "\n%google/protobuf/compiler/plugin.proto\022"
    "\030google.protobuf.compiler\032 google/protob"
    "uf/descriptor.proto\"}\n\024CodeGeneratorRequ"
    "est\022\030\n\020file_to_generate\030\001 \003(\t\022\021\n\tparamet"
    "er\030\002 \001(\t\0228\n\nproto_file\030\017 \003(\0132$.google.pr"
    "otobuf.FileDescriptorProto\"\252\001\n\025CodeGener"
    "atorResponse\022\r\n\005error\030\001 \001(\t\022B\n\004file\030\017 \003("
    "\01324.google.protobuf.compiler.CodeGenerat"
    "orResponse.File\032>\n\004File\022\014\n\004name\030\001 \001(\t\022\027\n"
    "\017insertion_point\030\002 \001(\t\022\017\n\007content\030\017 \001(\tB"
    ",\n\034com.google.protobuf.compilerB\014PluginP"
    "rotos", 445);
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(
    "google/protobuf/compiler/plugin.proto", &protobuf_RegisterTypes);
  CodeGeneratorRequest::default_instance_ = new CodeGeneratorRequest();
  CodeGeneratorResponse::default_instance_ = new CodeGeneratorResponse();
  CodeGeneratorResponse_File::default_instance_ = new CodeGeneratorResponse_File();
  CodeGeneratorRequest::default_instance_->InitAsDefaultInstance();
  CodeGeneratorResponse::default_instance_->InitAsDefaultInstance();
  CodeGeneratorResponse_File::default_instance_->InitAsDefaultInstance();
  ::google::protobuf::internal::OnShutdown(&protobuf_ShutdownFile_google_2fprotobuf_2fcompiler_2fplugin_2eproto);
}